

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::dht_tracker::incoming_error(dht_tracker *this,error_code *ec,endpoint *ep)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  
  iVar1 = ec->val_;
  if ((((iVar1 == 0x67) || (iVar1 == 0x68)) || (iVar1 == 0x6f)) &&
     (ec->cat_->id_ == 0x8fafd21e25c5e09b)) {
    for (p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
      dht::node::unreachable((node *)&p_Var2[1]._M_left,ep);
    }
  }
  return;
}

Assistant:

void dht_tracker::incoming_error(error_code const& ec, udp::endpoint const& ep)
	{
		if (ec == boost::asio::error::connection_refused
			|| ec == boost::asio::error::connection_reset
			|| ec == boost::asio::error::connection_aborted
#ifdef _WIN32
			|| ec == error_code(ERROR_HOST_UNREACHABLE, system_category())
			|| ec == error_code(ERROR_PORT_UNREACHABLE, system_category())
			|| ec == error_code(ERROR_CONNECTION_REFUSED, system_category())
			|| ec == error_code(ERROR_CONNECTION_ABORTED, system_category())
#endif
			)
		{
			for (auto& n : m_nodes)
				n.second.dht.unreachable(ep);
		}
	}